

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandCover(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pAVar3;
  char *pcVar4;
  uint local_54;
  uint local_50;
  int nCubesMax;
  int nFaninMax;
  int fUseInvs;
  int fUseEsop;
  int fUseSop;
  int fVerbose;
  int c;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAVar3 = Abc_FrameReadNtk(pAbc);
  fUseInvs = 1;
  nFaninMax = 0;
  fUseEsop = 0;
  nCubesMax = 1;
  local_50 = 8;
  local_54 = 8;
  Extra_UtilGetoptReset();
LAB_00279b61:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"IPsxivh");
    if (iVar1 == -1) {
      if (pAVar3 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      iVar1 = Abc_NtkIsStrash(pAVar3);
      if (iVar1 == 0) {
        Abc_Print(-1,"Only works for strashed networks.\n");
        return 1;
      }
      pAVar3 = Abc_NtkSopEsopCover(pAVar3,local_50,local_54,nFaninMax,fUseInvs,nCubesMax,fUseEsop);
      if (pAVar3 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Command has failed.\n");
        return 0;
      }
      Abc_FrameReplaceCurrentNetwork(pAbc,pAVar3);
      return 0;
    }
    switch(iVar1) {
    case 0x49:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-I\" should be followed by an integer.\n");
        goto LAB_00279d61;
      }
      local_50 = atoi(argv[globalUtilOptind]);
      uVar2 = local_50;
      break;
    default:
      goto LAB_00279d61;
    case 0x50:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-P\" should be followed by an integer.\n");
        goto LAB_00279d61;
      }
      local_54 = atoi(argv[globalUtilOptind]);
      uVar2 = local_54;
      break;
    case 0x68:
      goto LAB_00279d61;
    case 0x69:
      nCubesMax = nCubesMax ^ 1;
      goto LAB_00279b61;
    case 0x73:
      fUseInvs = fUseInvs ^ 1;
      goto LAB_00279b61;
    case 0x76:
      fUseEsop = fUseEsop ^ 1;
      goto LAB_00279b61;
    case 0x78:
      nFaninMax = nFaninMax ^ 1;
      goto LAB_00279b61;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)uVar2 < 0) {
LAB_00279d61:
      Abc_Print(-2,"usage: cover [-IP num] [-sxvh]\n");
      Abc_Print(-2,"\t         decomposition into a network of SOP/ESOP PLAs\n");
      Abc_Print(-2,"\t         (this command is known to have bugs)\n");
      Abc_Print(-2,"\t-I num : maximum number of inputs [default = %d]\n",(ulong)local_50);
      Abc_Print(-2,"\t-P num : maximum number of products [default = %d]\n",(ulong)local_54);
      pcVar4 = "no";
      if (fUseInvs != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-s     : toggle the use of SOPs [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (nFaninMax != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-x     : toggle the use of ESOPs [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (fUseEsop != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandCover( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c;
    int fVerbose;
    int fUseSop;
    int fUseEsop;
    int fUseInvs;
    int nFaninMax;
    int nCubesMax;
    pNtk = Abc_FrameReadNtk(pAbc);

    // set defaults
    fUseSop   =  1;
    fUseEsop  =  0;
    fVerbose  =  0;
    fUseInvs  =  1;
    nFaninMax =  8;
    nCubesMax =  8;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "IPsxivh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            nFaninMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFaninMax < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            nCubesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCubesMax < 0 )
                goto usage;
            break;
        case 's':
            fUseSop ^= 1;
            break;
        case 'x':
            fUseEsop ^= 1;
            break;
        case 'i':
            fUseInvs ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Only works for strashed networks.\n" );
        return 1;
    }

    // run the command
    pNtkRes = Abc_NtkSopEsopCover( pNtk, nFaninMax, nCubesMax, fUseEsop, fUseSop, fUseInvs, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Command has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: cover [-IP num] [-sxvh]\n" );
    Abc_Print( -2, "\t         decomposition into a network of SOP/ESOP PLAs\n" );
    Abc_Print( -2, "\t         (this command is known to have bugs)\n");
    Abc_Print( -2, "\t-I num : maximum number of inputs [default = %d]\n", nFaninMax );
    Abc_Print( -2, "\t-P num : maximum number of products [default = %d]\n", nCubesMax );
    Abc_Print( -2, "\t-s     : toggle the use of SOPs [default = %s]\n", fUseSop? "yes": "no" );
    Abc_Print( -2, "\t-x     : toggle the use of ESOPs [default = %s]\n", fUseEsop? "yes": "no" );
//    Abc_Print( -2, "\t-i     : toggle the use of interters [default = %s]\n", fUseInvs? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}